

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_linux.cpp
# Opt level: O0

QString * decodeFsEncString(QString *str)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  iterator pQVar4;
  qsizetype qVar5;
  QString *in_RDI;
  long in_FS_OFFSET;
  char16_t c_1;
  int c;
  qsizetype size;
  qsizetype out;
  qsizetype in;
  char16_t *ptr;
  qsizetype start;
  QString *decoded;
  undefined4 in_stack_ffffffffffffff68;
  CaseSensitivity in_stack_ffffffffffffff6c;
  QString *in_stack_ffffffffffffff70;
  QString *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff9c;
  QChar ch;
  long local_58;
  long local_50;
  QChar local_a;
  long local_8;
  
  ch.ucs = (char16_t)((uint)in_stack_ffffffffffffff9c >> 0x10);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QChar::QChar<char16_t,_true>(&local_a,L'\\');
  local_58 = QString::indexOf(in_stack_ffffffffffffff78,ch,(qsizetype)in_stack_ffffffffffffff70,
                              in_stack_ffffffffffffff6c);
  if (local_58 < 0) {
    QString::QString(in_stack_ffffffffffffff70,
                     (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  else {
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(in_stack_ffffffffffffff70,
                     (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    pQVar4 = QString::begin(in_stack_ffffffffffffff70);
    qVar5 = QString::size(in_RDI);
    local_50 = local_58;
    while (local_50 < qVar5) {
      if ((3 < qVar5 - local_50) && (pQVar4[local_50 + 1].ucs == L'x')) {
        iVar1 = QtMiscUtils::fromHex((uint)(ushort)pQVar4[local_50 + 2].ucs);
        uVar2 = iVar1 << 4;
        uVar3 = QtMiscUtils::fromHex((uint)(ushort)pQVar4[local_50 + 3].ucs);
        uVar3 = uVar3 | uVar2;
        if ((int)uVar3 < 0) {
          uVar3 = 0xfffd;
        }
        pQVar4[local_58].ucs = (char16_t)uVar3;
        local_50 = local_50 + 4;
        local_58 = local_58 + 1;
      }
      for (; (local_50 < qVar5 && (pQVar4[local_50].ucs != L'\\')); local_50 = local_50 + 1) {
        pQVar4[local_58].ucs = pQVar4[local_50].ucs;
        local_58 = local_58 + 1;
      }
    }
    QString::resize(in_stack_ffffffffffffff70,
                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString decodeFsEncString(QString &&str)
{
    using namespace QtMiscUtils;
    qsizetype start = str.indexOf(u'\\');
    if (start < 0)
        return std::move(str);

    // decode in-place
    QString decoded = std::move(str);
    auto ptr = reinterpret_cast<char16_t *>(decoded.begin());
    qsizetype in = start;
    qsizetype out = start;
    qsizetype size = decoded.size();

    while (in < size) {
        Q_ASSERT(ptr[in] == u'\\');
        if (size - in >= 4 && ptr[in + 1] == u'x') {    // we need four characters: \xAB
            int c = fromHex(ptr[in + 2]) << 4;
            c |= fromHex(ptr[in + 3]);
            if (Q_UNLIKELY(c < 0))
                c = QChar::ReplacementCharacter;        // bad hex sequence
            ptr[out++] = c;
            in += 4;
        }

        for ( ; in < size; ++in) {
            char16_t c = ptr[in];
            if (c == u'\\')
                break;
            ptr[out++] = c;
        }
    }
    decoded.resize(out);
    return decoded;
}